

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkDupSingleNodes(Wlc_Ntk_t *p)

{
  Wlc_Obj_t *pWVar1;
  Wlc_Obj_t *pWVar2;
  char *__s;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  Vec_Int_t *vFanins;
  Wlc_Ntk_t *p_00;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar8;
  size_t sVar9;
  char *__dest;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  uVar6 = p->nObjsAlloc;
  if (1 < p->iObj) {
    uVar11 = 1;
    if (1 < (int)uVar6) {
      uVar11 = uVar6;
    }
    if (uVar11 - 1 <= p->iObj - 2U) {
LAB_00370671:
      __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                    ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
    }
  }
  if ((p->vCopies).nCap < (int)uVar6) {
    piVar7 = (p->vCopies).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar6 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar6 << 2);
    }
    (p->vCopies).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar6;
  }
  if (0 < (int)uVar6) {
    memset((p->vCopies).pArray,0,(ulong)uVar6 * 4);
  }
  (p->vCopies).nSize = uVar6;
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  piVar7 = (int *)malloc(400);
  vFanins->pArray = piVar7;
  p_00 = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  iVar4 = p->fAsyncRst;
  iVar5 = p->fMemPorts;
  iVar3 = p->fEasyFfs;
  p_00->fSmtLib = p->fSmtLib;
  p_00->fAsyncRst = iVar4;
  p_00->fMemPorts = iVar5;
  p_00->fEasyFfs = iVar3;
  iVar4 = p->iObj;
  if (1 < iVar4) {
    lVar13 = 1;
    do {
      if (p->nObjsAlloc <= lVar13) goto LAB_00370671;
      uVar10 = *(ushort *)(p->pObjs + lVar13);
      if ((uVar10 & 0x3d) != 1) {
        pWVar1 = p->pObjs + lVar13;
        uVar10 = uVar10 & 0x3f;
        if (uVar10 == 8) {
          uVar6 = pWVar1->nFanins;
          if ((int)uVar6 < 4) goto LAB_003704fa;
        }
        else if (uVar10 != 0x2d) {
          uVar6 = pWVar1->nFanins;
LAB_003704fa:
          uVar12 = (ulong)uVar6;
          if (0 < (int)uVar6) {
            lVar15 = 0;
            do {
              if ((2 < (uint)uVar12) ||
                 (paVar8 = &pWVar1->field_10, (*(uint *)pWVar1 & 0x3f | 0x10) == 0x16)) {
                paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
              }
              iVar4 = paVar8->Fanins[lVar15];
              lVar14 = (long)iVar4;
              if ((lVar14 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_00370671;
              pWVar2 = p->pObjs;
              iVar5 = Wlc_ObjAlloc(p_00,1,*(uint *)(pWVar2 + lVar14) >> 6 & 1,pWVar2[lVar14].End,
                                   pWVar2[lVar14].Beg);
              if ((iVar5 < 1) || (p_00->nObjsAlloc <= iVar5)) goto LAB_00370671;
              if ((p->vCopies).nSize <= iVar4) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              (p->vCopies).pArray[lVar14] = iVar5;
              lVar15 = lVar15 + 1;
              uVar12 = (ulong)(int)pWVar1->nFanins;
            } while (lVar15 < (long)uVar12);
          }
          uVar6 = Wlc_ObjDup(p_00,p,(int)lVar13,vFanins);
          if (((int)uVar6 < 1) || (p_00->nObjsAlloc <= (int)uVar6)) goto LAB_00370671;
          *(ushort *)(p_00->pObjs + uVar6) = *(ushort *)(p_00->pObjs + uVar6) | 0x200;
          Vec_IntPush(&p_00->vPos,uVar6);
          iVar4 = p->iObj;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar4);
    piVar7 = vFanins->pArray;
  }
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(vFanins);
  Wlc_NtkTransferNames(p_00,p);
  __s = p->pSpec;
  if (__s != (char *)0x0) {
    sVar9 = strlen(__s);
    __dest = (char *)malloc(sVar9 + 1);
    strcpy(__dest,__s);
    p_00->pSpec = __dest;
  }
  return p_00;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupSingleNodes( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Vec_Int_t * vFanins;
    Wlc_Obj_t * pObj, * pObjNew;
    Wlc_Obj_t * pFanin, * pFaninNew;
    int i, k, iFanin, iFaninNew, iObjNew, Count = 0;
    // count objects
    Wlc_NtkForEachObj( p, pObj, i )
        if ( !Wlc_ObjIsCi(pObj) )
            Count += 1 + Wlc_ObjFaninNum(pObj);
    // copy objects
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) )
            continue;
        if ( pObj->Type == WLC_OBJ_ARI_MULTI )
            continue;
        if ( pObj->Type == WLC_OBJ_MUX && Wlc_ObjFaninNum(pObj) > 3 )
            continue;
        // create CIs for the fanins
        Wlc_ObjForEachFanin( pObj, iFanin, k )
        {
            pFanin = Wlc_NtkObj(p, iFanin);
            iFaninNew = Wlc_ObjAlloc( pNew, WLC_OBJ_PI, pFanin->Signed, pFanin->End, pFanin->Beg );
            pFaninNew = Wlc_NtkObj(pNew, iFaninNew);
            Wlc_ObjSetCopy( p, iFanin, iFaninNew );
            //Wlc_ObjSetCi( pNew, pFaninNew );
        }
        // create object
        iObjNew = Wlc_ObjDup( pNew, p, i, vFanins );
        pObjNew = Wlc_NtkObj(pNew, iObjNew);
        pObjNew->fIsPo = 1;
        Vec_IntPush( &pNew->vPos, iObjNew );
    }
    Vec_IntFree( vFanins );
    Wlc_NtkTransferNames( pNew, p );
    if ( p->pSpec )
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    return pNew;
}